

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-lore.c
# Opt level: O1

void lore_append_awareness(textblock *tb,monster_race *race,monster_lore *lore,bitflag *known_flags)

{
  monster_sex_t mVar1;
  char *pcVar2;
  short *psVar3;
  short sVar4;
  
  if (((tb == (textblock *)0x0) || (race == (monster_race *)0x0)) || (lore == (monster_lore *)0x0))
  {
    __assert_fail("tb && race && lore",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/mon-lore.c"
                  ,0x597,
                  "void lore_append_awareness(textblock *, const struct monster_race *, const struct monster_lore *, bitflag *)"
                 );
  }
  mVar1 = lore_monster_sex(race);
  if (lore->sleep_known != true) {
    return;
  }
  sVar4 = 200;
  psVar3 = (short *)(lore_describe_awareness_lore_awareness_description + 0x10);
  pcVar2 = "is ever vigilant for";
  do {
    if (sVar4 < (short)race->sleep) {
      pcVar2 = *(char **)(psVar3 + -4);
      break;
    }
    sVar4 = *psVar3;
    psVar3 = psVar3 + 8;
  } while (sVar4 != 0x7fff);
  textblock_append(tb,"%s %s intruders, which %s may notice from ",
                   *(undefined8 *)(lore_pronoun_nominative_lore_pronouns + (ulong)mVar1 * 0x10 + 8),
                   pcVar2,*(undefined8 *)
                           (lore_pronoun_nominative_lore_pronouns + (ulong)mVar1 * 0x10));
  textblock_append_c(tb,'\x0e',"%d",(ulong)(uint)(race->hearing * 10));
  textblock_append(tb," feet.  ");
  return;
}

Assistant:

void lore_append_awareness(textblock *tb, const struct monster_race *race,
						   const struct monster_lore *lore,
						   bitflag known_flags[RF_SIZE])
{
	monster_sex_t msex = MON_SEX_NEUTER;

	assert(tb && race && lore);

	/* Extract a gender (if applicable) */
	msex = lore_monster_sex(race);

	/* Do we know how aware it is? */
	if (lore->sleep_known)
	{
		const char *aware = lore_describe_awareness(race->sleep);
		textblock_append(tb, "%s %s intruders, which %s may notice from ",
						 lore_pronoun_nominative(msex, true), aware,
						 lore_pronoun_nominative(msex, false));
		textblock_append_c(tb, COLOUR_L_BLUE, "%d", 10 * race->hearing);
		textblock_append(tb, " feet.  ");
	}
}